

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall
cmCTestLaunch::LoadScrapeRules
          (cmCTestLaunch *this,char *purpose,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  bool bVar1;
  string line;
  char *purpose_local;
  string fname;
  ifstream fin;
  RegularExpression rex;
  
  purpose_local = purpose;
  cmStrCat<std::__cxx11::string_const&,char_const(&)[7],char_const*&,char_const(&)[5]>
            (&fname,&(this->Reporter).LogDir,(char (*) [7])0x70ab9d,&purpose_local,
             (char (*) [5])0x707e8a);
  std::ifstream::ifstream(&fin,fname._M_dataplus._M_p,_S_in|_S_bin);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  rex.regmust = (char *)0x0;
  rex.program = (char *)0x0;
  line.field_2._M_local_buf[0] = '\0';
  rex.progsize = 0;
  memset(&rex,0,0x20a);
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&fin,&line,(bool *)0x0,0xffffffffffffffff);
    if (!bVar1) break;
    bVar1 = cmsys::RegularExpression::compile(&rex,line._M_dataplus._M_p);
    if (bVar1) {
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                (regexps,&rex);
    }
  }
  cmsys::RegularExpression::~RegularExpression(&rex);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules(
  const char* purpose, std::vector<cmsys::RegularExpression>& regexps) const
{
  std::string fname =
    cmStrCat(this->Reporter.LogDir, "Custom", purpose, ".txt");
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  cmsys::RegularExpression rex;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (rex.compile(line)) {
      regexps.push_back(rex);
    }
  }
}